

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreFactoryTestCase.cpp
# Opt level: O0

void __thiscall callCreateFixture::callCreateFixture(callCreateFixture *this)

{
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  callCreateFixture *local_10;
  callCreateFixture *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"store",&local_31);
  FIX::FileStoreFactory::FileStoreFactory(&this->object,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"FS",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"FACT",&local_91);
  FIX::deleteSession(&local_68,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

callCreateFixture()
      : object("store") {
    deleteSession("FS", "FACT");
  }